

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

QMimeData * __thiscall QListWidget::mimeData(QListWidget *this,QList<QListWidgetItem_*> *items)

{
  QList<QModelIndex> *this_00;
  long lVar1;
  QListWidgetItem **ppQVar2;
  undefined8 uVar3;
  long lVar4;
  QList_conflict *pQVar5;
  QMimeData *pQVar6;
  char *__s;
  long lVar7;
  long in_FS_OFFSET;
  QListWidgetItem **local_38;
  
  local_38 = *(QListWidgetItem ***)(in_FS_OFFSET + 0x28);
  lVar4 = QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
  if (*(long *)(lVar4 + 0x38) == 0) {
    this_00 = (QList<QModelIndex> *)(lVar4 + 0x28);
    QList<QModelIndex>::reserve(this_00,(items->d).size);
    lVar1 = (items->d).size;
    if (lVar1 != 0) {
      ppQVar2 = (items->d).ptr;
      lVar7 = 0;
      do {
        uVar3 = *(undefined8 *)((long)ppQVar2 + lVar7);
        __s = (char *)QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
        QListModel::index((QListModel *)&stack0xffffffffffffffb0,__s,(int)uVar3);
        QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
                  ((QMovableArrayOps<QModelIndex> *)this_00,*(qsizetype *)(lVar4 + 0x38),
                   (QModelIndex *)&stack0xffffffffffffffb0);
        QList<QModelIndex>::end(this_00);
        lVar7 = lVar7 + 8;
      } while (lVar1 << 3 != lVar7);
    }
    pQVar5 = (QList_conflict *)QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
    pQVar6 = (QMimeData *)QAbstractItemModel::mimeData(pQVar5);
    QList<QModelIndex>::clear(this_00);
    if (*(QListWidgetItem ***)(in_FS_OFFSET + 0x28) == local_38) {
      return pQVar6;
    }
  }
  else {
    pQVar5 = (QList_conflict *)QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
    if (*(QListWidgetItem ***)(in_FS_OFFSET + 0x28) == local_38) {
      pQVar6 = (QMimeData *)QAbstractItemModel::mimeData(pQVar5);
      return pQVar6;
    }
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QListWidget::mimeData(const QList<QListWidgetItem *> &items) const
{
    Q_D(const QListWidget);

    QModelIndexList &cachedIndexes = d->listModel()->cachedIndexes;

    // if non empty, it's called from the model's own mimeData
    if (cachedIndexes.isEmpty()) {
        cachedIndexes.reserve(items.size());
        for (QListWidgetItem *item : items)
            cachedIndexes << indexFromItem(item);

        QMimeData *result = d->listModel()->internalMimeData();

        cachedIndexes.clear();
        return result;
    }

    return d->listModel()->internalMimeData();
}